

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

int __thiscall crnlib::mipmapped_texture::init(mipmapped_texture *this,EVP_PKEY_CTX *ctx)

{
  component_flags cVar1;
  uint uVar2;
  int iVar3;
  dxt_format dVar4;
  mip_level *pmVar5;
  vector<crnlib::mip_level_*> *pvVar6;
  mip_level **ppmVar7;
  dxt_image *this_00;
  uint in_ECX;
  uint in_EDX;
  uint in_R8D;
  pixel_format in_R9D;
  long in_stack_00000008;
  image_u8 *p_1;
  dxt_image *p;
  uint mip_height;
  uint mip_width;
  uint l;
  uint f;
  mipmapped_texture *in_stack_ffffffffffffffb0;
  uint max_len;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_ffffffffffffffc0;
  dxt_image *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint local_24;
  uint local_20;
  
  clear(in_stack_ffffffffffffffb0);
  max_len = (uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  *(uint *)&((dxt_image *)this)->m_pElements = (uint)ctx;
  *(uint *)((long)&((dxt_image *)this)->m_pElements + 4) = in_EDX;
  cVar1 = pixel_format_helpers::get_component_flags(in_R9D);
  ((dxt_image *)this)->m_width = cVar1;
  ((dxt_image *)this)->m_height = in_R9D;
  if (in_stack_00000008 != 0) {
    dynamic_string::set((dynamic_string *)in_stack_ffffffffffffffc0,(char *)this,max_len);
  }
  vector<crnlib::vector<crnlib::mip_level_*>_>::resize
            ((vector<crnlib::vector<crnlib::mip_level_*>_> *)in_stack_ffffffffffffffc0,
             (uint)((ulong)this >> 0x20),SUB81((ulong)this >> 0x18,0));
  for (local_20 = 0; local_20 < in_R8D; local_20 = local_20 + 1) {
    vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
              ((face_vec *)&((dxt_image *)this)->m_blocks_x,local_20);
    vector<crnlib::mip_level_*>::resize
              ((vector<crnlib::mip_level_*> *)in_stack_ffffffffffffffc0,(uint)((ulong)this >> 0x20),
               SUB81((ulong)this >> 0x18,0));
    for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
      pmVar5 = crnlib_new<crnlib::mip_level>();
      pvVar6 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                         ((face_vec *)&((dxt_image *)this)->m_blocks_x,local_20);
      ppmVar7 = vector<crnlib::mip_level_*>::operator[](pvVar6,local_24);
      *ppmVar7 = pmVar5;
      math::maximum<unsigned_int>(1,(uint)ctx >> ((byte)local_24 & 0x1f));
      uVar2 = math::maximum<unsigned_int>(1,in_EDX >> ((byte)local_24 & 0x1f));
      iVar3 = pixel_format_helpers::is_dxt(in_R9D);
      if (iVar3 == 0) {
        in_stack_ffffffffffffffc0 =
             crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,unsigned_int,unsigned_int>
                       ((uint *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                        (uint *)in_stack_ffffffffffffffc8);
        image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
                  (in_stack_ffffffffffffffc0,((dxt_image *)this)->m_width);
        pvVar6 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                           ((face_vec *)&((dxt_image *)this)->m_blocks_x,local_20);
        vector<crnlib::mip_level_*>::operator[](pvVar6,local_24);
        mip_level::assign((mip_level *)in_stack_ffffffffffffffc0,(image_u8 *)this,
                          (pixel_format)((ulong)pmVar5 >> 0x20),(orientation_flags_t)pmVar5);
      }
      else {
        this_00 = crnlib_new<crnlib::dxt_image>();
        in_stack_ffffffffffffffc8 = this_00;
        dVar4 = pixel_format_helpers::get_dxt_format(in_R9D);
        dxt_image::init(this_00,(EVP_PKEY_CTX *)(ulong)(uint)dVar4);
        pvVar6 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                           ((face_vec *)&((dxt_image *)this)->m_blocks_x,local_20);
        vector<crnlib::mip_level_*>::operator[](pvVar6,local_24);
        mip_level::assign((mip_level *)in_stack_ffffffffffffffc0,(dxt_image *)this,
                          (pixel_format)((ulong)pmVar5 >> 0x20),(orientation_flags_t)pmVar5);
      }
    }
  }
  return local_20;
}

Assistant:

void mipmapped_texture::init(uint width, uint height, uint levels, uint faces, pixel_format fmt, const char* pName, orientation_flags_t orient_flags) {
  clear();

  CRNLIB_ASSERT((width > 0) && (height > 0) && (levels > 0));
  CRNLIB_ASSERT((faces == 1) || (faces == 6));

  m_width = width;
  m_height = height;
  m_comp_flags = pixel_format_helpers::get_component_flags(fmt);
  m_format = fmt;
  if (pName)
    m_name.set(pName);

  m_faces.resize(faces);
  for (uint f = 0; f < faces; f++) {
    m_faces[f].resize(levels);
    for (uint l = 0; l < levels; l++) {
      m_faces[f][l] = crnlib_new<mip_level>();

      const uint mip_width = math::maximum(1U, width >> l);
      const uint mip_height = math::maximum(1U, height >> l);
      if (pixel_format_helpers::is_dxt(fmt)) {
        dxt_image* p = crnlib_new<dxt_image>();
        p->init(pixel_format_helpers::get_dxt_format(fmt), mip_width, mip_height, true);
        m_faces[f][l]->assign(p, m_format, orient_flags);
      } else {
        image_u8* p = crnlib_new<image_u8>(mip_width, mip_height);
        p->set_comp_flags(m_comp_flags);
        m_faces[f][l]->assign(p, m_format, orient_flags);
      }
    }
  }

  CRNLIB_ASSERT(check());
}